

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

Orphan<capnp::DynamicList> * __thiscall
capnp::JsonCodec::decodeArray
          (Orphan<capnp::DynamicList> *__return_storage_ptr__,JsonCodec *this,Reader input,
          ListSchema type,Orphanage orphanage)

{
  Reader input_00;
  Orphanage orphanage_00;
  ListSchema schema;
  bool bVar1;
  uint uVar2;
  unsigned_long *puVar3;
  Range<unsigned_long> RVar4;
  Type type_00;
  Reader local_138;
  Orphan<capnp::DynamicValue> local_108;
  unsigned_long local_d0;
  unsigned_long i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> *__range1;
  undefined1 local_90 [8];
  Builder output;
  JsonCodec *this_local;
  Orphanage orphanage_local;
  ListSchema type_local;
  Orphan<capnp::DynamicList> *orphan;
  
  orphanage_local.arena = (BuilderArena *)orphanage.capTable;
  this_local = (JsonCodec *)orphanage.arena;
  output.builder._32_8_ = type.elementType._0_8_;
  orphanage_local.capTable = (CapTableBuilder *)output.builder._32_8_;
  uVar2 = List<capnp::json::Value,_(capnp::Kind)3>::Reader::size(&input);
  schema.elementType.field_4.schema = type.elementType.field_4.schema;
  schema.elementType._0_8_ = output.builder._32_8_;
  Orphanage::newOrphan(__return_storage_ptr__,(Orphanage *)&this_local,schema,uVar2);
  Orphan<capnp::DynamicList>::get((Builder *)local_90,__return_storage_ptr__);
  RVar4 = kj::indices<capnp::List<capnp::json::Value,(capnp::Kind)3>::Reader&>(&input);
  __begin1.value = RVar4.begin_;
  __end1 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1);
  i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1);
  while (bVar1 = kj::Range<unsigned_long>::Iterator::operator==(&__end1,(Iterator *)&i),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    puVar3 = kj::Range<unsigned_long>::Iterator::operator*(&__end1);
    local_d0 = *puVar3;
    uVar2 = (uint)local_d0;
    List<capnp::json::Value,_(capnp::Kind)3>::Reader::operator[](&local_138,&input,(uint)local_d0);
    type_00 = ListSchema::getElementType((ListSchema *)&orphanage_local.capTable);
    orphanage_00.capTable = (CapTableBuilder *)orphanage_local.arena;
    orphanage_00.arena = (BuilderArena *)this_local;
    input_00._reader.capTable = local_138._reader.capTable;
    input_00._reader.segment = local_138._reader.segment;
    input_00._reader.data = local_138._reader.data;
    input_00._reader.pointers = local_138._reader.pointers;
    input_00._reader.dataSize = local_138._reader.dataSize;
    input_00._reader.pointerCount = local_138._reader.pointerCount;
    input_00._reader._38_2_ = local_138._reader._38_2_;
    input_00._reader.nestingLimit = local_138._reader.nestingLimit;
    input_00._reader._44_4_ = local_138._reader._44_4_;
    decode(&local_108,this,input_00,type_00,orphanage_00);
    DynamicList::Builder::adopt((Builder *)local_90,uVar2,&local_108);
    Orphan<capnp::DynamicValue>::~Orphan(&local_108);
    kj::Range<unsigned_long>::Iterator::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicList> JsonCodec::decodeArray(List<JsonValue>::Reader input, ListSchema type, Orphanage orphanage) const {
  auto orphan = orphanage.newOrphan(type, input.size());
  auto output = orphan.get();
  for (auto i: kj::indices(input)) {
    output.adopt(i, decode(input[i], type.getElementType(), orphanage));
  }
  return orphan;
}